

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O2

void __thiscall
Js::NumberFormatPartsBuilder::NumberFormatPartsBuilder
          (NumberFormatPartsBuilder *this,double num,char16 *formatted,charcount_t formattedLength,
          ScriptContext *scriptContext)

{
  Recycler *this_00;
  UNumberFormatFields *ptr;
  ulong count;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  this->num = num;
  Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierSet(&this->formatted,formatted);
  this->formattedLength = formattedLength;
  Memory::WriteBarrierPtr<Js::ScriptContext>::WriteBarrierSet(&this->sc,scriptContext);
  count = (ulong)formattedLength;
  local_50 = (undefined1  [8])&UNumberFormatFields::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_65688cc;
  data.filename._0_4_ = 0x90d;
  data.plusSize = count;
  this_00 = Memory::Recycler::TrackAllocInfo(((this->sc).ptr)->recycler,(TrackAllocData *)local_50);
  ptr = Memory::AllocateArray<Memory::Recycler,UNumberFormatFields,false>
                  ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,count);
  Memory::WriteBarrierPtr<UNumberFormatFields>::WriteBarrierSet(&this->fields,ptr);
  memset((this->fields).ptr,0xff,count << 2);
  return;
}

Assistant:

NumberFormatPartsBuilder(double num, const char16 *formatted, charcount_t formattedLength, ScriptContext *scriptContext)
            : num(num)
            , formatted(formatted)
            , formattedLength(formattedLength)
            , sc(scriptContext)
            , fields(RecyclerNewArrayLeaf(sc->GetRecycler(), UNumberFormatFields, formattedLength))
        {
            // this will allow InsertPart to tell what fields have been initialized or not, and will
            // be the value of resulting { type: "literal" } fields in ToPartsArray
            memset(fields, UnsetField, sizeof(UNumberFormatFields) * formattedLength);
        }